

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void body(LexState *ls,expdesc *e,int needself,int line)

{
  byte bVar1;
  FuncState *pFVar2;
  Proto *pPVar3;
  GCObject *o;
  int iVar4;
  TString *pTVar5;
  Node *pNVar6;
  long lVar7;
  uint bc;
  ulong uVar8;
  int iVar9;
  FuncState new_fs;
  
  open_func(ls,&new_fs);
  (new_fs.f)->linedefined = line;
  checknext(ls,0x28);
  if (needself != 0) {
    pTVar5 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar5,0);
    adjustlocalvars(ls,1);
  }
  pFVar2 = ls->fs;
  pPVar3 = pFVar2->f;
  pPVar3->is_vararg = '\0';
  iVar4 = (ls->t).token;
  iVar9 = 0;
  if (iVar4 != 0x29) {
    iVar9 = 0;
    while (iVar4 == 0x11d) {
      pTVar5 = str_checkname(ls);
      new_localvar(ls,pTVar5,iVar9);
      if (pPVar3->is_vararg != '\0') {
LAB_0010d083:
        iVar9 = iVar9 + 1;
        goto LAB_0010d0a9;
      }
      iVar4 = testnext(ls,0x2c);
      if (iVar4 == 0) goto LAB_0010d083;
      iVar9 = iVar9 + 1;
      iVar4 = (ls->t).token;
    }
    if (iVar4 != 0x117) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    pPVar3->is_vararg = pPVar3->is_vararg | 2;
  }
LAB_0010d0a9:
  adjustlocalvars(ls,iVar9);
  bVar1 = pFVar2->nactvar;
  pPVar3->numparams = bVar1 - (pPVar3->is_vararg & 1);
  luaK_reserveregs(pFVar2,(uint)bVar1);
  checknext(ls,0x29);
  chunk(ls);
  (new_fs.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  close_func(ls);
  pFVar2 = ls->fs;
  o = (GCObject *)pFVar2->f;
  iVar4 = (o->p).sizep;
  iVar9 = iVar4;
  if (iVar4 <= pFVar2->np) {
    pNVar6 = (Node *)luaM_growaux_(ls->L,(o->h).node,&(o->p).sizep,8,0x3ffff,
                                   "constant table overflow");
    (o->h).node = pNVar6;
    iVar9 = (o->p).sizep;
  }
  for (lVar7 = (long)iVar4; lVar7 < iVar9; lVar7 = lVar7 + 1) {
    (&(((o->h).node)->i_val).value)[lVar7].gc = (GCObject *)0x0;
  }
  pNVar6 = (o->h).node;
  bc = pFVar2->np;
  pFVar2->np = bc + 1;
  (&(pNVar6->i_val).value)[(int)bc].gc = (GCObject *)new_fs.f;
  if ((((new_fs.f)->marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrierf(ls->L,o,(GCObject *)new_fs.f);
    bc = pFVar2->np - 1;
  }
  iVar4 = luaK_codeABx(pFVar2,OP_CLOSURE,0,bc);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).s.info = iVar4;
  for (uVar8 = 0; uVar8 < (new_fs.f)->nups; uVar8 = uVar8 + 1) {
    luaK_codeABC(pFVar2,(uint)(new_fs.upvalues[uVar8].k != '\x06') << 2,0,
                 (uint)new_fs.upvalues[uVar8].info,0);
  }
  return;
}

Assistant:

static void body(LexState*ls,expdesc*e,int needself,int line){
FuncState new_fs;
open_func(ls,&new_fs);
new_fs.f->linedefined=line;
checknext(ls,'(');
if(needself){
new_localvarliteral(ls,"self",0);
adjustlocalvars(ls,1);
}
parlist(ls);
checknext(ls,')');
chunk(ls);
new_fs.f->lastlinedefined=ls->linenumber;
check_match(ls,TK_END,TK_FUNCTION,line);
close_func(ls);
pushclosure(ls,&new_fs,e);
}